

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_wString __thiscall ON_XMLVariant::AsString(ON_XMLVariant *this)

{
  ON_wString *pOVar1;
  ON_Buffer *this_00;
  ON__UINT64 size;
  void *buffer_00;
  long *in_RSI;
  wchar_t *s;
  char *buf;
  ON__UINT64 buf_size;
  ON_Buffer *buffer;
  ON_wString local_20 [2];
  ON_XMLVariant *this_local;
  
  this_local = this;
  switch(*(undefined4 *)(in_RSI[1] + 0xa4)) {
  case 0:
  default:
    ON_wString::ON_wString((ON_wString *)this,L"");
    break;
  case 1:
    s = L"false";
    if ((*(byte *)(in_RSI[1] + 0x10) & 1) != 0) {
      s = L"true";
    }
    ON_wString::operator=((ON_wString *)(in_RSI[1] + 8),s);
  case 5:
    ON_wString::ON_wString((ON_wString *)this,(ON_wString *)(in_RSI[1] + 8));
    break;
  case 2:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleToString
                       ((ON_XMLVariantPrivate *)in_RSI[1],(double)*(int *)(in_RSI[1] + 0x10));
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 3:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleToString
                       ((ON_XMLVariantPrivate *)in_RSI[1],(double)*(float *)(in_RSI[1] + 0x10));
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 4:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleToString
                       ((ON_XMLVariantPrivate *)in_RSI[1],*(double *)(in_RSI[1] + 0x10));
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 6:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleArrayToString((ON_XMLVariantPrivate *)in_RSI[1],2);
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 7:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleArrayToString((ON_XMLVariantPrivate *)in_RSI[1],3);
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 8:
  case 9:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleArrayToString((ON_XMLVariantPrivate *)in_RSI[1],4);
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 10:
    pOVar1 = ON_XMLVariantPrivate::ConvertDoubleArrayToString
                       ((ON_XMLVariantPrivate *)in_RSI[1],0x10);
    ON_wString::ON_wString((ON_wString *)this,pOVar1);
    break;
  case 0xb:
    ON_UuidToString((ON_UUID *)(in_RSI[1] + 0x10),(ON_wString *)(in_RSI[1] + 8));
    ON_wString::MakeUpperOrdinal((ON_wString *)(in_RSI[1] + 8));
    ON_wString::ON_wString((ON_wString *)this,(ON_wString *)(in_RSI[1] + 8));
    break;
  case 0xc:
    TimeToString((time_t)local_20);
    ON_wString::operator=((ON_wString *)(in_RSI[1] + 8),local_20);
    ON_wString::~ON_wString(local_20);
    ON_wString::ON_wString((ON_wString *)this,(ON_wString *)(in_RSI[1] + 8));
    break;
  case 0xd:
    ON_wString::operator=((ON_wString *)(in_RSI[1] + 8),wszBase64Prefix);
    this_00 = (ON_Buffer *)(**(code **)(*in_RSI + 0x60))();
    size = ON_Buffer::Size(this_00);
    buffer_00 = operator_new__(size);
    ON_Buffer::Read(this_00,size,buffer_00);
    ON_Base64::Encode(buffer_00,size,(ON_wString *)(in_RSI[1] + 8),true);
    if (buffer_00 != (void *)0x0) {
      operator_delete__(buffer_00);
    }
    ON_wString::ON_wString((ON_wString *)this,(ON_wString *)(in_RSI[1] + 8));
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLVariant::AsString(void) const
{
  switch (_private->_type)
  {
  case Types::Integer:
    return _private->ConvertDoubleToString(double(_private->_int_val));

  case Types::Float:
    return _private->ConvertDoubleToString(double(_private->_float_val));

  case Types::Double:
    return _private->ConvertDoubleToString(_private->_double_val);

  case Types::DoubleArray3:
    return _private->ConvertDoubleArrayToString(3);

  case Types::DoubleArray4:
  case Types::DoubleColor4:
    return _private->ConvertDoubleArrayToString(4);

  case Types::DoubleArray2:
    return _private->ConvertDoubleArrayToString(2);

  case Types::Matrix:
    return _private->ConvertDoubleArrayToString(16);

  case Types::Bool:
    _private->_string_val = _private->_bool_val ? L"true" : L"false";
    // No break...
  case Types::String:
    return _private->_string_val;

  case Types::Uuid:
    ON_UuidToString(_private->_uuid_val, _private->_string_val);
    _private->_string_val.MakeUpperOrdinal();
    return _private->_string_val;

  case Types::Time:
    _private->_string_val = TimeToString(_private->_time_val);
    return _private->_string_val;

  case Types::Buffer:
    {
      _private->_string_val = wszBase64Prefix;
      auto& buffer = GetBuffer();
      const auto buf_size = buffer.Size();
      auto* buf = new char[size_t(buf_size)];
      buffer.Read(buf_size, buf);
      ON_Base64::Encode(buf, size_t(buf_size), _private->_string_val, true);
      delete[] buf;
      return _private->_string_val;
    }
  
  case Types::Null:
  default:
    break;
  }

  return L"";
}